

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

DataBlob __thiscall
hrgls::datablob::DataBlobSource::GetNextBlob(DataBlobSource *this,timeval timeout)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  reference copy;
  mapped_type *pmVar4;
  long in_RCX;
  long *plVar5;
  rep_conflict rVar6;
  key_type local_98;
  key_type local_90;
  lock_guard<std::mutex> local_88;
  lock_guard<std::mutex> lock_1;
  undefined4 local_74;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  time_point now;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> lock;
  time_point start;
  duration<float,_std::ratio<1L,_1L>_> dt;
  double timeoutSeconds;
  bool empty;
  DataBlobSource *this_local;
  timeval timeout_local;
  DataBlob *ret;
  
  plVar5 = (long *)timeout.tv_sec;
  DataBlob::DataBlob((DataBlob *)this);
  if (*plVar5 != 0) {
    lock._M_device = (mutex_type *)std::chrono::_V2::system_clock::now();
    do {
      std::lock_guard<std::mutex>::lock_guard(&local_58,(mutex_type *)(*plVar5 + 0xd8));
      bVar3 = std::__cxx11::
              list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>::empty
                        ((list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>
                          *)(*plVar5 + 0x100));
      local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      lock_1._M_device =
           (mutex_type *)
           std::chrono::operator-
                     (&local_70,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&lock);
      std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<float,std::ratio<1l,1l>> *)&local_74,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)&lock_1);
      start.__d.__r._4_4_ = local_74;
      std::lock_guard<std::mutex>::~lock_guard(&local_58);
      bVar2 = false;
      if (bVar3) {
        rVar6 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count
                          ((duration<float,_std::ratio<1L,_1L>_> *)((long)&start.__d.__r + 4));
        bVar2 = (double)rVar6 < (double)timeout.tv_usec + (double)in_RCX / 1000000.0;
      }
    } while (bVar2);
    if (bVar3) {
      lVar1 = *plVar5;
      local_98._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                             *)(lVar1 + 0x38),&local_98);
      *pmVar4 = 1;
    }
    else {
      std::lock_guard<std::mutex>::lock_guard(&local_88,(mutex_type *)(*plVar5 + 0xd8));
      copy = std::__cxx11::
             list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>::front
                       ((list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>
                         *)(*plVar5 + 0x100));
      DataBlob::operator=((DataBlob *)this,copy);
      std::__cxx11::list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_>::
      pop_front((list<hrgls::datablob::DataBlob,_std::allocator<hrgls::datablob::DataBlob>_> *)
                (*plVar5 + 0x100));
      lVar1 = *plVar5;
      local_90._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                             *)(lVar1 + 0x38),&local_90);
      *pmVar4 = 0;
      std::lock_guard<std::mutex>::~lock_guard(&local_88);
    }
  }
  return (DataBlob)(DataBlob_private *)this;
}

Assistant:

DataBlob DataBlobSource::GetNextBlob(struct timeval timeout)
    {
      DataBlob ret;
      if (!m_private) {
        return ret;
      }

      // Keep checking for a new blob until we either find one or time out.
      bool empty;
      double timeoutSeconds = timeout.tv_sec + timeout.tv_usec / 1e6;
      std::chrono::duration<float> dt;
      auto start = std::chrono::system_clock::now();
      do {
        std::lock_guard<std::mutex> lock(m_private->storedBlobsMutex);
        empty = m_private->storedBlobs.empty();
        auto now = std::chrono::system_clock::now();
        dt = now - start;
      } while (empty && (dt.count() < timeoutSeconds));

      if (!empty) {
        std::lock_guard<std::mutex> lock(m_private->storedBlobsMutex);
        ret = m_private->storedBlobs.front();
        m_private->storedBlobs.pop_front();
        m_private->status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
      } else {
        m_private->status[std::this_thread::get_id()] = hrgls_STATUS_TIMEOUT;
      }

      return ret;
    }